

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiWindow_*> *pIVar1;
  ImVector<ImGuiWindow_*> *this;
  ImVector<ImGuiViewportP_*> *this_00;
  ImVector<ImGuiViewport_*> *this_01;
  ImVec2 IVar2;
  ImVec2 IVar3;
  uint move_flags;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow *pIVar6;
  char *text;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  bool bVar16;
  ImGuiKeyModFlags IVar17;
  ImU32 IVar18;
  undefined4 extraout_EAX;
  int iVar19;
  ImGuiWindow *pIVar20;
  ImGuiViewportP **ppIVar21;
  ImDrawList *pIVar22;
  ImGuiWindow **ppIVar23;
  ImGuiViewport *pIVar24;
  char *pcVar25;
  ImVec2 *pIVar26;
  ImGuiContext *g_1;
  long lVar27;
  int i;
  char *label;
  int viewport_n;
  int iVar28;
  ImGuiWindow *window;
  ImGuiDir clip_dir;
  uint uVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar30;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar31;
  ImRect IVar32;
  ImRect inner;
  ImRect local_b8;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  ImGuiContext *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  ImGuiContext *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar10 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1187,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x118c,"void ImGui::EndFrame()");
  }
  CallContextHooks(GImGui,ImGuiContextHookType_EndFramePre);
  pIVar9 = GImGui;
  IVar17 = GetMergedKeyModFlags();
  if ((pIVar9->IO).KeyMods != IVar17) {
    __assert_fail("g.IO.KeyMods == expected_key_mod_flags && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1dd0,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar28 = (pIVar9->CurrentWindowStack).Size;
  if (iVar28 != 1) {
    if (1 < iVar28) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1dd9,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1ddf,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var4 = (pIVar10->PlatformIO).Platform_SetImeInputPos;
  if (p_Var4 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
    fVar30 = (pIVar10->PlatformImeLastPos).x;
    if ((fVar30 != 3.4028235e+38) || (NAN(fVar30))) {
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      fVar30 = (pIVar10->PlatformImePos).x - fVar30;
      fVar31 = (pIVar10->PlatformImePos).y - (pIVar10->PlatformImeLastPos).y;
      if (fVar30 * fVar30 + fVar31 * fVar31 <= 0.0001) goto LAB_001289ce;
    }
    pIVar5 = pIVar10->PlatformImePosViewport;
    if ((pIVar5 != (ImGuiViewportP *)0x0) && (pIVar5->PlatformWindowCreated == true)) {
      (*p_Var4)(&pIVar5->super_ImGuiViewport,pIVar10->PlatformImePos);
      pIVar10->PlatformImeLastPos = pIVar10->PlatformImePos;
      pIVar10->PlatformImePosViewport = (ImGuiViewportP *)0x0;
    }
  }
LAB_001289ce:
  pIVar10->WithinFrameScopeWithImplicitWindow = false;
  local_50 = pIVar10;
  pIVar20 = pIVar10->CurrentWindow;
  if ((pIVar20 != (ImGuiWindow *)0x0) && (pIVar20->WriteAccessed == false)) {
    pIVar20->Active = false;
  }
  End();
  pIVar10 = GImGui;
  pIVar20 = GetTopMostPopupModal();
  if (pIVar20 != (ImGuiWindow *)0x0 || pIVar10->NavWindowingTargetAnim != (ImGuiWindow *)0x0) {
    local_a8 = (undefined1  [8])pIVar10->NavWindowingTargetAnim;
    local_90 = (ImGuiContext *)CONCAT44(local_90._4_4_,0x31 - (uint)(pIVar20 == (ImGuiWindow *)0x0))
    ;
    for (iVar28 = 0; iVar28 < (pIVar10->Viewports).Size; iVar28 = iVar28 + 1) {
      ppIVar21 = ImVector<ImGuiViewportP_*>::operator[](&pIVar10->Viewports,iVar28);
      pIVar5 = *ppIVar21;
      if ((((pIVar20 == (ImGuiWindow *)0x0) || (pIVar5 != pIVar20->Viewport)) &&
          ((pIVar10->NavWindowingListWindow == (ImGuiWindow *)0x0 ||
           (pIVar5 != pIVar10->NavWindowingListWindow->Viewport)))) &&
         ((pIVar10->NavWindowingTargetAnim == (ImGuiWindow *)0x0 ||
          (pIVar5 != pIVar10->NavWindowingTargetAnim->Viewport)))) {
        pIVar22 = GetForegroundDrawList(&pIVar5->super_ImGuiViewport);
        IVar18 = GetColorU32((ImGuiCol)local_90,pIVar10->DimBgRatio);
        IVar2 = (pIVar5->super_ImGuiViewport).Pos;
        IVar3 = (pIVar5->super_ImGuiViewport).Size;
        in_XMM1_Dc = 0;
        in_XMM1_Dd = 0;
        local_b8.Min.y = IVar3.y + IVar2.y;
        local_b8.Min.x = IVar3.x + IVar2.x;
        ImDrawList::AddRectFilled
                  (pIVar22,&(pIVar5->super_ImGuiViewport).Pos,&local_b8.Min,IVar18,0.0,0xf);
      }
    }
    if ((local_a8 != (undefined1  [8])0x0) &&
       (pIVar20 = pIVar10->NavWindowingTargetAnim, pIVar20->Active == true)) {
      local_90 = pIVar10;
      ppIVar23 = &pIVar20->RootWindow;
      do {
        pIVar6 = *ppIVar23;
        pIVar1 = &(pIVar6->DC).ChildWindows;
        iVar28 = (pIVar6->DC).ChildWindows.Size;
        do {
          iVar19 = iVar28;
          if (iVar19 < 1) {
            pIVar22 = pIVar6->DrawList;
            ImDrawList::PushClipRectFullScreen(pIVar22);
            pIVar10 = local_90;
            if (((pIVar20->RootWindowDockStop->field_0x492 & 1) != 0) &&
               (pIVar6 = pIVar20->RootWindow, pIVar6 != pIVar20->RootWindowDockStop)) {
              IVar32 = ImGuiWindow::Rect(pIVar6);
              fStack_a0 = (float)extraout_XMM0_Dc;
              local_a8._0_4_ = IVar32.Min.x;
              local_a8._4_4_ = IVar32.Min.y;
              fStack_9c = (float)extraout_XMM0_Dd;
              fStack_60 = (float)in_XMM1_Dc;
              local_68._0_4_ = IVar32.Max.x;
              local_68._4_4_ = IVar32.Max.y;
              fStack_5c = (float)in_XMM1_Dd;
              IVar32 = ImGuiWindow::Rect(pIVar20->RootWindowDockStop);
              local_78._8_4_ = extraout_XMM0_Dc_00;
              local_78._0_4_ = IVar32.Min.x;
              local_78._4_4_ = IVar32.Min.y;
              local_78._12_4_ = extraout_XMM0_Dd_00;
              local_88._8_4_ = in_XMM1_Dc;
              local_88._0_4_ = IVar32.Max.x;
              local_88._4_4_ = IVar32.Max.y;
              local_88._12_4_ = in_XMM1_Dd;
              IVar18 = GetColorU32(0x30,pIVar10->DimBgRatio);
              auVar14 = _local_68;
              auVar13 = local_78;
              auVar12 = local_88;
              auVar8 = _local_a8;
              IVar32.Max.x = (float)local_68._0_4_;
              IVar32.Max.y = (float)local_68._4_4_;
              IVar32.Min.x = (float)local_a8._0_4_;
              IVar32.Min.y = (float)local_a8._4_4_;
              inner.Max.x = (float)local_88._0_4_;
              inner.Max.y = (float)local_88._4_4_;
              inner.Min.x = (float)local_78._0_4_;
              inner.Min.y = (float)local_78._4_4_;
              _local_a8 = auVar8;
              local_88 = auVar12;
              local_78 = auVar13;
              _local_68 = auVar14;
              RenderRectFilledWithHole(pIVar22,IVar32,inner,IVar18,(pIVar10->Style).WindowRounding);
            }
            local_78 = ZEXT416((uint)pIVar20->WindowRounding);
            local_88 = ZEXT416((uint)(pIVar10->Style).WindowRounding);
            IVar32 = ImGuiWindow::Rect(pIVar20);
            fVar30 = pIVar10->FontSize;
            local_48 = IVar32.Min.x - fVar30;
            fStack_44 = IVar32.Min.y - fVar30;
            local_68._4_4_ = fStack_44;
            local_68._0_4_ = local_48;
            fStack_60 = IVar32.Max.x - fVar30;
            fStack_5c = IVar32.Max.y - fVar30;
            fStack_40 = fVar30 + IVar32.Max.x;
            fStack_3c = fVar30 + IVar32.Max.y;
            local_a8._4_4_ = fVar30 + IVar32.Min.y;
            local_a8._0_4_ = fVar30 + IVar32.Min.x;
            fStack_a0 = fStack_40;
            fStack_9c = fStack_3c;
            local_b8.Min.y = fStack_44;
            local_b8.Min.x = local_48;
            local_b8.Max.y = fStack_3c;
            local_b8.Max.x = fStack_40;
            IVar32 = ImGuiViewportP::GetMainRect(pIVar20->Viewport);
            auVar8._4_4_ = -(uint)(IVar32.Max.y <= fStack_9c);
            auVar8._0_4_ = -(uint)(IVar32.Max.x <= fStack_a0);
            auVar8._8_4_ = -(uint)(local_68._0_4_ <= IVar32.Min.x);
            auVar8._12_4_ = -(uint)(local_68._4_4_ <= IVar32.Min.y);
            iVar28 = movmskps(extraout_EAX,auVar8);
            if (iVar28 == 0xf) {
              fVar30 = -1.0 - pIVar10->FontSize;
              local_b8.Min.y = fStack_44 - fVar30;
              local_b8.Min.x = local_48 - fVar30;
              local_b8.Max.y = fVar30 + fStack_3c;
              local_b8.Max.x = fVar30 + fStack_40;
              _local_a8 = ZEXT416((uint)pIVar20->WindowRounding);
            }
            else {
              local_a8._4_4_ = local_78._4_4_ & local_88._4_4_;
              local_a8._0_4_ =
                   ~-(uint)((float)local_88._0_4_ <= (float)local_78._0_4_) & local_88._0_4_ |
                   local_78._0_4_ & -(uint)((float)local_88._0_4_ <= (float)local_78._0_4_);
              fStack_a0 = (float)(local_78._8_4_ & local_88._8_4_);
              fStack_9c = (float)(local_78._12_4_ & local_88._12_4_);
            }
            IVar18 = GetColorU32(0x2f,pIVar10->NavWindowingHighlightAlpha);
            ImDrawList::AddRect(pIVar22,&local_b8.Min,&local_b8.Max,IVar18,(float)local_a8._0_4_,-1,
                                3.0);
            ImDrawList::PopClipRect(pIVar22);
            goto LAB_00128ceb;
          }
          iVar28 = iVar19 + -1;
          ppIVar23 = ImVector<ImGuiWindow_*>::operator[](pIVar1,iVar28);
        } while (((*ppIVar23)->Active != true) || ((*ppIVar23)->Hidden == true));
        ppIVar23 = ImVector<ImGuiWindow_*>::operator[](pIVar1,iVar19 + -1);
      } while( true );
    }
  }
LAB_00128ceb:
  pIVar10 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar20 = FindWindowByName("###NavWindowingList");
      pIVar10->NavWindowingListWindow = pIVar20;
    }
    pIVar24 = GetMainViewport();
    pIVar9 = GImGui;
    IVar2.y = (pIVar24->Size).y * 0.2;
    IVar2.x = (pIVar24->Size).x * 0.2;
    (GImGui->NextWindowData).SizeConstraintRect.Min = IVar2;
    (pIVar9->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar9->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar9->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar9->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar2 = pIVar24->Pos;
    IVar3 = pIVar24->Size;
    (pIVar9->NextWindowData).Flags = (pIVar9->NextWindowData).Flags | 0x11;
    IVar7.y = IVar3.y * 0.5 + IVar2.y;
    IVar7.x = IVar3.x * 0.5 + IVar2.x;
    (pIVar9->NextWindowData).PosVal = IVar7;
    (pIVar9->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar9->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar9->NextWindowData).PosCond = 1;
    (pIVar9->NextWindowData).PosUndock = true;
    IVar2 = (pIVar10->Style).WindowPadding;
    fVar30 = IVar2.x;
    fVar31 = IVar2.y;
    local_b8.Min.y = fVar31 + fVar31;
    local_b8.Min.x = fVar30 + fVar30;
    PushStyleVar(1,&local_b8.Min);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    iVar28 = (pIVar10->WindowsFocusOrder).Size;
    while (0 < iVar28) {
      iVar28 = iVar28 + -1;
      ppIVar23 = ImVector<ImGuiWindow_*>::operator[](&pIVar10->WindowsFocusOrder,iVar28);
      pIVar20 = *ppIVar23;
      bVar15 = IsWindowNavFocusable(pIVar20);
      if (bVar15) {
        text = pIVar20->Name;
        pcVar25 = FindRenderedTextEnd(text,(char *)0x0);
        label = text;
        if (text == pcVar25) {
          label = "(Popup)";
          if (((uint)pIVar20->Flags >> 0x1a & 1) == 0) {
            if (((uint)pIVar20->Flags >> 10 & 1) != 0) {
              iVar19 = strcmp(text,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar19 == 0) goto LAB_00128e77;
            }
            label = "(Dock node)";
            if (pIVar20->DockNodeAsHost == (ImGuiDockNode *)0x0) {
              label = "(Untitled)";
            }
          }
        }
LAB_00128e77:
        local_b8.Min.x = 0.0;
        local_b8.Min.y = 0.0;
        Selectable(label,pIVar10->NavWindowingTarget == pIVar20,0,&local_b8.Min);
      }
    }
    End();
    PopStyleVar(1);
  }
  pIVar20 = pIVar10->NavWrapRequestWindow;
  if ((pIVar20 != (ImGuiWindow *)0x0) && (pIVar10->NavWindow == pIVar20)) {
    move_flags = pIVar10->NavWrapRequestFlags;
    bVar15 = NavMoveRequestButNoResultYet();
    if ((bVar15) &&
       ((pIVar10->NavMoveRequestForward == ImGuiNavForward_None &&
        (pIVar10->NavLayer == ImGuiNavLayer_Main)))) {
      if (move_flags == 0) {
        __assert_fail("move_flags != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x264c,"void ImGui::NavEndFrame()");
      }
      local_b8.Min = pIVar20->NavRectRel[0].Min;
      local_b8.Max = pIVar20->NavRectRel[0].Max;
      iVar28 = pIVar10->NavMoveDir;
      clip_dir = iVar28;
      if (iVar28 == 0) {
        if ((move_flags & 5) != 0) {
          fVar30 = (pIVar20->SizeFull).x;
          fVar31 = (pIVar20->WindowPadding).x;
          fVar31 = fVar31 + fVar31 + (pIVar20->ContentSize).x;
          uVar29 = -(uint)(fVar31 <= fVar30);
          fVar30 = (float)(uVar29 & (uint)fVar30 | ~uVar29 & (uint)fVar31) - (pIVar20->Scroll).x;
          clip_dir = 0;
          if ((move_flags & 4) != 0) {
            fVar31 = local_b8.Max.y - local_b8.Min.y;
            local_b8.Min.y = local_b8.Min.y - fVar31;
            local_b8.Max.y = local_b8.Max.y - fVar31;
            clip_dir = 2;
          }
          local_b8.Max.x = fVar30;
          local_b8.Min.x = fVar30;
          NavMoveRequestForward(0,clip_dir,&local_b8,move_flags);
          iVar28 = pIVar10->NavMoveDir;
          goto LAB_00128fa7;
        }
        iVar28 = 0;
        clip_dir = 0;
      }
      else {
LAB_00128fa7:
        if (iVar28 == 1 && (move_flags & 5) != 0) {
          fVar30 = (pIVar20->Scroll).x;
          fVar11 = local_b8.Max.y;
          local_b8.Max = (ImVec2)(CONCAT44(local_b8.Max.y,fVar30) ^ 0x80000000);
          fVar31 = local_b8.Min.y;
          local_b8.Min = (ImVec2)(CONCAT44(local_b8.Min.y,fVar30) ^ 0x80000000);
          if ((move_flags & 4) != 0) {
            fVar30 = fVar11 - fVar31;
            local_b8.Min.y = fVar31 + fVar30;
            local_b8.Max.y = fVar30 + fVar11;
            clip_dir = 3;
          }
          NavMoveRequestForward(1,clip_dir,&local_b8,move_flags);
          iVar28 = pIVar10->NavMoveDir;
        }
      }
      if ((move_flags & 10) != 0 && iVar28 == 2) {
        fVar30 = (pIVar20->SizeFull).y;
        fVar31 = (pIVar20->WindowPadding).y;
        fVar31 = fVar31 + fVar31 + (pIVar20->ContentSize).y;
        uVar29 = -(uint)(fVar31 <= fVar30);
        fVar30 = (float)(uVar29 & (uint)fVar30 | ~uVar29 & (uint)fVar31) - (pIVar20->Scroll).y;
        if ((move_flags & 8) != 0) {
          fVar31 = local_b8.Max.x - local_b8.Min.x;
          local_b8.Min.x = local_b8.Min.x - fVar31;
          local_b8.Max.x = local_b8.Max.x - fVar31;
          clip_dir = 0;
        }
        local_b8.Max.y = fVar30;
        local_b8.Min.y = fVar30;
        NavMoveRequestForward(2,clip_dir,&local_b8,move_flags);
        iVar28 = pIVar10->NavMoveDir;
      }
      if (iVar28 == 3 && (move_flags & 10) != 0) {
        fVar30 = (pIVar20->Scroll).y;
        fVar11 = local_b8.Max.x;
        local_b8.Max = (ImVec2)(CONCAT44(fVar30,local_b8.Max.x) ^ 0x8000000000000000);
        fVar31 = local_b8.Min.x;
        local_b8.Min = (ImVec2)(CONCAT44(fVar30,local_b8.Min.x) ^ 0x8000000000000000);
        if ((move_flags & 8) != 0) {
          clip_dir = 1;
          fVar30 = fVar11 - fVar31;
          local_b8.Min.x = fVar31 + fVar30;
          local_b8.Max.x = fVar30 + fVar11;
        }
        NavMoveRequestForward(3,clip_dir,&local_b8,move_flags);
      }
    }
  }
  pIVar10 = local_50;
  pIVar9 = GImGui;
  if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
    GImGui->CurrentDpiScale = 1.0;
    pIVar9->CurrentViewport = (ImGuiViewportP *)0x0;
  }
  if (local_50->DragDropActive != true) goto LAB_00129198;
  bVar15 = (local_50->DragDropPayload).Delivery;
  if ((local_50->DragDropPayload).DataFrameCount + 1 < local_50->FrameCount) {
    if ((local_50->DragDropSourceFlags & 0x20) == 0) {
      bVar16 = IsMouseDown(local_50->DragDropMouseButton);
      bVar16 = !bVar16;
      goto LAB_0012918b;
    }
  }
  else {
    bVar16 = false;
LAB_0012918b:
    if ((!bVar16) && (bVar15 == false)) goto LAB_00129198;
  }
  ClearDragDrop();
LAB_00129198:
  iVar28 = pIVar10->FrameCount;
  if (((pIVar10->DragDropActive == true) && (pIVar10->DragDropSourceFrameCount < iVar28)) &&
     ((pIVar10->DragDropSourceFlags & 1) == 0)) {
    pIVar10->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar10->DragDropWithinSource = false;
    iVar28 = pIVar10->FrameCount;
  }
  pIVar10->WithinFrameScope = false;
  pIVar10->FrameCountEnded = iVar28;
  UpdateMouseMovingWindowEndFrame();
  pIVar9 = GImGui;
  this_00 = &GImGui->Viewports;
  iVar28 = 0;
  ppIVar21 = ImVector<ImGuiViewportP_*>::operator[](this_00,0);
  (pIVar9->PlatformIO).MainViewport = &(*ppIVar21)->super_ImGuiViewport;
  this_01 = &(pIVar9->PlatformIO).Viewports;
  ImVector<ImGuiViewport_*>::resize(this_01,0);
  do {
    if (this_00->Size <= iVar28) {
      ppIVar21 = ImVector<ImGuiViewportP_*>::operator[](this_00,0);
      pIVar5 = *ppIVar21;
      (pIVar5->super_ImGuiViewport).PlatformRequestMove = false;
      (pIVar5->super_ImGuiViewport).PlatformRequestResize = false;
      (pIVar5->super_ImGuiViewport).PlatformRequestClose = false;
      pIVar1 = &pIVar10->WindowsTempSortBuffer;
      ImVector<ImGuiWindow_*>::resize(pIVar1,0);
      this = &pIVar10->Windows;
      ImVector<ImGuiWindow_*>::reserve(pIVar1,(pIVar10->Windows).Size);
      for (iVar28 = 0; iVar28 != this->Size; iVar28 = iVar28 + 1) {
        ppIVar23 = ImVector<ImGuiWindow_*>::operator[](this,iVar28);
        pIVar20 = *ppIVar23;
        if ((pIVar20->Active != true) || ((pIVar20->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(pIVar1,pIVar20);
        }
      }
      if (pIVar1->Size == iVar28) {
        ImVector<ImGuiWindow_*>::swap(this,pIVar1);
        (pIVar10->IO).MetricsActiveWindows = pIVar10->WindowsActiveCount;
        ((pIVar10->IO).Fonts)->Locked = false;
        (pIVar10->IO).MouseWheel = 0.0;
        (pIVar10->IO).MouseWheelH = 0.0;
        ImVector<unsigned_short>::resize(&(pIVar10->IO).InputQueueCharacters,0);
        (pIVar10->IO).NavInputs[0x10] = 0.0;
        (pIVar10->IO).NavInputs[0x11] = 0.0;
        (pIVar10->IO).NavInputs[0x12] = 0.0;
        (pIVar10->IO).NavInputs[0x13] = 0.0;
        (pIVar10->IO).NavInputs[0xc] = 0.0;
        (pIVar10->IO).NavInputs[0xd] = 0.0;
        (pIVar10->IO).NavInputs[0xe] = 0.0;
        (pIVar10->IO).NavInputs[0xf] = 0.0;
        (pIVar10->IO).NavInputs[8] = 0.0;
        (pIVar10->IO).NavInputs[9] = 0.0;
        (pIVar10->IO).NavInputs[10] = 0.0;
        (pIVar10->IO).NavInputs[0xb] = 0.0;
        (pIVar10->IO).NavInputs[4] = 0.0;
        (pIVar10->IO).NavInputs[5] = 0.0;
        (pIVar10->IO).NavInputs[6] = 0.0;
        (pIVar10->IO).NavInputs[7] = 0.0;
        (pIVar10->IO).NavInputs[0] = 0.0;
        (pIVar10->IO).NavInputs[1] = 0.0;
        (pIVar10->IO).NavInputs[2] = 0.0;
        (pIVar10->IO).NavInputs[3] = 0.0;
        (pIVar10->IO).NavInputs[0x14] = 0.0;
        CallContextHooks(pIVar10,ImGuiContextHookType_EndFramePost);
        return;
      }
      __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x11d1,"void ImGui::EndFrame()");
    }
    pIVar26 = (ImVec2 *)ImVector<ImGuiViewportP_*>::operator[](this_00,iVar28);
    IVar2 = *pIVar26;
    *(undefined8 *)((long)IVar2 + 0x7c) = *(undefined8 *)((long)IVar2 + 8);
    if ((*(int *)((long)IVar2 + 0x68) < pIVar9->FrameCount) ||
       (*(float *)((long)IVar2 + 0x10) <= 0.0)) {
      if (iVar28 == 0) {
        lVar27 = *(long *)((long)IVar2 + 0x90);
        if (lVar27 != 0) goto LAB_00129293;
        goto LAB_001292a5;
      }
    }
    else if ((iVar28 == 0) || (0.0 < *(float *)((long)IVar2 + 0x14))) {
      lVar27 = *(long *)((long)IVar2 + 0x90);
      if (lVar27 == 0) {
        if (iVar28 != 0) {
          __assert_fail("viewport->Window != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2c32,"void ImGui::UpdateViewportsEndFrame()");
        }
      }
      else {
LAB_00129293:
        if ((*(char *)(lVar27 + 0xbf) != '\x01') || (*(char *)(lVar27 + 0xc6) != '\0'))
        goto LAB_001292b4;
      }
LAB_001292a5:
      local_b8.Min = IVar2;
      ImVector<ImGuiViewport_*>::push_back(this_01,(ImGuiViewport **)&local_b8);
    }
LAB_001292b4:
    iVar28 = iVar28 + 1;
  } while( true );
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}